

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall Fl_Text_Buffer::count_lines(Fl_Text_Buffer *this,int startPos,int endPos)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = this->mGapStart;
  iVar2 = 0;
  if (startPos < iVar1) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      if ((long)endPos - (long)startPos == lVar3) {
        return iVar2;
      }
      iVar2 = iVar2 + (uint)(this->mBuf[lVar3 + startPos] == '\n');
      lVar3 = lVar3 + 1;
    } while ((startPos - iVar1) + (int)lVar3 != 0);
    startPos = startPos + (int)lVar3;
  }
  if (startPos != endPos && startPos < this->mLength) {
    lVar3 = (long)startPos;
    do {
      lVar3 = lVar3 + 1;
      iVar2 = (uint)(this->mBuf[lVar3 + (long)(this->mGapEnd - iVar1) + -1] == '\n') + iVar2;
      if (endPos == lVar3) {
        return iVar2;
      }
    } while (lVar3 < this->mLength);
  }
  return iVar2;
}

Assistant:

int Fl_Text_Buffer::count_lines(int startPos, int endPos) const {
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED2(this, (endPos))
  
  int gapLen = mGapEnd - mGapStart;
  int lineCount = 0;
  
  int pos = startPos;
  while (pos < mGapStart)
  {
    if (pos == endPos)
      return lineCount;
    if (mBuf[pos++] == '\n')
      lineCount++;
  } 
  while (pos < mLength) {
    if (pos == endPos)
      return lineCount;
    if (mBuf[pos++ + gapLen] == '\n')
      lineCount++;
  }
  return lineCount;
}